

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tests.cpp
# Opt level: O3

void __thiscall serialize_tests::array::test_method(array *this)

{
  long *__nbytes;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  const_string file;
  const_string msg;
  DataStream ds;
  array<unsigned_char,_32UL> array2;
  array<unsigned_char,_32UL> array1;
  char *local_e0;
  char *local_d8;
  lazy_ostream local_d0;
  undefined1 *local_c0;
  char **local_b8;
  assertion_result local_b0;
  undefined1 *local_98;
  undefined1 *local_90;
  char *local_88;
  char *local_80;
  undefined1 local_78 [32];
  char local_58;
  char cStack_57;
  char cStack_56;
  char cStack_55;
  char cStack_54;
  char cStack_53;
  char cStack_52;
  char cStack_51;
  char cStack_50;
  char cStack_4f;
  char cStack_4e;
  char cStack_4d;
  char cStack_4c;
  char cStack_4b;
  char cStack_4a;
  char cStack_49;
  char local_48;
  char cStack_47;
  char cStack_46;
  char cStack_45;
  char cStack_44;
  char cStack_43;
  char cStack_42;
  char cStack_41;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  char cStack_3d;
  char cStack_3c;
  char cStack_3b;
  char cStack_3a;
  char cStack_39;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  __nbytes = &local_18;
  local_28 = 0x100010101010000;
  uStack_20 = 0x10000;
  local_38 = 0x10101000001;
  uStack_30 = 0x1010000010000;
  local_78._16_16_ = (undefined1  [16])0x0;
  local_78._0_16_ = (undefined1  [16])0x0;
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)local_78,0,&local_38);
  DataStream::read((DataStream *)local_78,(int)&local_58,(void *)0x20,(size_t)__nbytes);
  local_88 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_80 = "";
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xcb;
  file.m_begin = (iterator)&local_88;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_98,msg);
  auVar2[0] = -(local_48 == (char)local_28);
  auVar2[1] = -(cStack_47 == local_28._1_1_);
  auVar2[2] = -(cStack_46 == local_28._2_1_);
  auVar2[3] = -(cStack_45 == local_28._3_1_);
  auVar2[4] = -(cStack_44 == local_28._4_1_);
  auVar2[5] = -(cStack_43 == local_28._5_1_);
  auVar2[6] = -(cStack_42 == local_28._6_1_);
  auVar2[7] = -(cStack_41 == local_28._7_1_);
  auVar2[8] = -(cStack_40 == (char)uStack_20);
  auVar2[9] = -(cStack_3f == uStack_20._1_1_);
  auVar2[10] = -(cStack_3e == uStack_20._2_1_);
  auVar2[0xb] = -(cStack_3d == uStack_20._3_1_);
  auVar2[0xc] = -(cStack_3c == uStack_20._4_1_);
  auVar2[0xd] = -(cStack_3b == uStack_20._5_1_);
  auVar2[0xe] = -(cStack_3a == uStack_20._6_1_);
  auVar2[0xf] = -(cStack_39 == uStack_20._7_1_);
  auVar1[0] = -(local_58 == (char)local_38);
  auVar1[1] = -(cStack_57 == local_38._1_1_);
  auVar1[2] = -(cStack_56 == local_38._2_1_);
  auVar1[3] = -(cStack_55 == local_38._3_1_);
  auVar1[4] = -(cStack_54 == local_38._4_1_);
  auVar1[5] = -(cStack_53 == local_38._5_1_);
  auVar1[6] = -(cStack_52 == local_38._6_1_);
  auVar1[7] = -(cStack_51 == local_38._7_1_);
  auVar1[8] = -(cStack_50 == (char)uStack_30);
  auVar1[9] = -(cStack_4f == uStack_30._1_1_);
  auVar1[10] = -(cStack_4e == uStack_30._2_1_);
  auVar1[0xb] = -(cStack_4d == uStack_30._3_1_);
  auVar1[0xc] = -(cStack_4c == uStack_30._4_1_);
  auVar1[0xd] = -(cStack_4b == uStack_30._5_1_);
  auVar1[0xe] = -(cStack_4a == uStack_30._6_1_);
  auVar1[0xf] = -(cStack_49 == uStack_30._7_1_);
  auVar1 = auVar1 & auVar2;
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar1[0xf] >> 7) << 0xf) == 0xffff);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_b8 = &local_e0;
  local_e0 = "array1 == array2";
  local_d8 = "";
  local_d0.m_empty = false;
  local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d0,1,0,WARN,0xf102f0,(size_t)&stack0xffffffffffffff10,0xcb);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(array)
{
    std::array<uint8_t, 32> array1{1, 0, 0, 1, 1, 1, 0, 0, 0, 0, 1, 0, 0, 1, 1, 0, 0, 0, 1, 1, 1, 1, 0, 1, 0, 0, 1};
    DataStream ds;
    ds << array1;
    std::array<uint8_t, 32> array2;
    ds >> array2;
    BOOST_CHECK(array1 == array2);
}